

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_mark_uv(global_State *g)

{
  undefined1 *local_18;
  GCupval *uv;
  global_State *g_local;
  
  for (local_18 = *(undefined1 **)((long)&(g->uvhead).field_5 + 8);
      (GCupval *)local_18 != &g->uvhead; local_18 = *(undefined1 **)(local_18 + 0x18)) {
    if ((((local_18[8] & 7) == 0) &&
        (0xfffffff6 < (int)((long)**(undefined8 **)(local_18 + 0x20) >> 0x2f) + 4U)) &&
       ((*(byte *)((**(ulong **)(local_18 + 0x20) & 0x7fffffffffff) + 8) & 3) != 0)) {
      gc_mark(g,(GCobj *)(**(ulong **)(local_18 + 0x20) & 0x7fffffffffff));
    }
  }
  return;
}

Assistant:

static void gc_mark_uv(global_State *g)
{
  GCupval *uv;
  for (uv = uvnext(&g->uvhead); uv != &g->uvhead; uv = uvnext(uv)) {
    lj_assertG(uvprev(uvnext(uv)) == uv && uvnext(uvprev(uv)) == uv,
	       "broken upvalue chain");
    if (isgray(obj2gco(uv)))
      gc_marktv(g, uvval(uv));
  }
}